

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::DisplayGraph(cmComputeTargetDepends *this,Graph *graph,string *name)

{
  uint uVar1;
  pointer pcVar2;
  pointer pcVar3;
  FILE *pFVar4;
  ulong uVar5;
  string *psVar6;
  cmGraphEdge *ni;
  pointer pcVar7;
  char *pcVar8;
  ulong uVar9;
  
  fprintf(_stderr,"The %s target dependency graph is:\n",(name->_M_dataplus)._M_p);
  uVar5 = ((long)(graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                 super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  uVar9 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar9 = 0;
  }
  for (uVar5 = 0; pFVar4 = _stderr, uVar5 != uVar9; uVar5 = uVar5 + 1) {
    pcVar2 = (graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->Targets).
                        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar5]);
    fprintf(pFVar4,"target %d is [%s]\n",uVar5 & 0xffffffff,(psVar6->_M_dataplus)._M_p);
    pcVar3 = *(pointer *)
              ((long)&pcVar2[uVar5].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
    for (pcVar7 = *(pointer *)
                   &pcVar2[uVar5].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>; pFVar4 = _stderr,
        pcVar7 != pcVar3; pcVar7 = pcVar7 + 1) {
      uVar1 = pcVar7->Dest;
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((this->Targets).
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar1]);
      pcVar8 = "weak";
      if (pcVar7->Strong != false) {
        pcVar8 = "strong";
      }
      fprintf(pFVar4,"  depends on target %d [%s] (%s)\n",(ulong)uVar1,(psVar6->_M_dataplus)._M_p,
              pcVar8);
    }
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeTargetDepends::DisplayGraph(Graph const& graph,
                                          const std::string& name)
{
  fprintf(stderr, "The %s target dependency graph is:\n", name.c_str());
  int n = static_cast<int>(graph.size());
  for (int depender_index = 0; depender_index < n; ++depender_index) {
    EdgeList const& nl = graph[depender_index];
    cmGeneratorTarget const* depender = this->Targets[depender_index];
    fprintf(stderr, "target %d is [%s]\n", depender_index,
            depender->GetName().c_str());
    for (cmGraphEdge const& ni : nl) {
      int dependee_index = ni;
      cmGeneratorTarget const* dependee = this->Targets[dependee_index];
      fprintf(stderr, "  depends on target %d [%s] (%s)\n", dependee_index,
              dependee->GetName().c_str(), ni.IsStrong() ? "strong" : "weak");
    }
  }
  fprintf(stderr, "\n");
}